

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O0

void __thiscall
rengine::AllocationPool<rengine::RectangleNode>::setMemory
          (AllocationPool<rengine::RectangleNode> *this,void *m,uint blockCount)

{
  uint local_20;
  uint i;
  uint blockCount_local;
  void *m_local;
  AllocationPool<rengine::RectangleNode> *this_local;
  
  if (this->m_memory != (RectangleNode *)0x0) {
    __assert_fail("m_memory == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x31,
                  "void rengine::AllocationPool<rengine::RectangleNode>::setMemory(void *, unsigned int) [T = rengine::RectangleNode]"
                 );
  }
  if (this->m_free != (uint *)0x0) {
    __assert_fail("m_free == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x32,
                  "void rengine::AllocationPool<rengine::RectangleNode>::setMemory(void *, unsigned int) [T = rengine::RectangleNode]"
                 );
  }
  if (this->m_nextFree != 0) {
    __assert_fail("m_nextFree == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x33,
                  "void rengine::AllocationPool<rengine::RectangleNode>::setMemory(void *, unsigned int) [T = rengine::RectangleNode]"
                 );
  }
  if (this->m_poolSize == 0) {
    this->m_poolSize = blockCount;
    this->m_memory = (RectangleNode *)m;
    this->m_free = (uint *)(this->m_memory + blockCount);
    this->m_nextFree = 0;
    for (local_20 = 0; local_20 < blockCount; local_20 = local_20 + 1) {
      this->m_free[local_20] = local_20;
    }
    return;
  }
  __assert_fail("m_poolSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x34,
                "void rengine::AllocationPool<rengine::RectangleNode>::setMemory(void *, unsigned int) [T = rengine::RectangleNode]"
               );
}

Assistant:

void setMemory(void *m, unsigned blockCount) {
        assert(m_memory == 0);
        assert(m_free == 0);
        assert(m_nextFree == 0);
        assert(m_poolSize == 0);

        m_poolSize = blockCount;
        m_memory = (T *) m;
        m_free = (unsigned *) (m_memory + blockCount);
        m_nextFree = 0;
        for (unsigned i=0; i<blockCount; ++i)
            m_free[i] = i;
    }